

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynNumber * ParseNumber(ParseContext *ctx)

{
  Lexeme *begin;
  undefined1 auVar1 [16];
  int iVar2;
  undefined4 extraout_var;
  Lexeme *end;
  char *pcVar3;
  InplaceStr IVar4;
  InplaceStr IVar5;
  SynNumber *this;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_number) {
    IVar4 = ParseContext::Consume(ctx);
    if (ctx->currentLexeme->type == lex_string) {
      IVar5 = ParseContext::Consume(ctx);
      pcVar3 = IVar5.end;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = IVar4.end;
      IVar5 = (InplaceStr)(auVar1 << 0x40);
      pcVar3 = (char *)0x0;
    }
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    this = (SynNumber *)CONCAT44(extraout_var,iVar2);
    end = ParseContext::Previous(ctx);
    SynBase::SynBase((SynBase *)this,0xf,begin,end);
    (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_0023f450;
    this->value = IVar4;
    (this->suffix).begin = IVar5.begin;
    (this->suffix).end = pcVar3;
  }
  else {
    this = (SynNumber *)0x0;
  }
  return this;
}

Assistant:

SynNumber* ParseNumber(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.At(lex_number))
	{
		InplaceStr value = ctx.Consume();

		InplaceStr suffix;

		if(ctx.At(lex_string))
			suffix = ctx.Consume();

		return new (ctx.get<SynNumber>()) SynNumber(start, ctx.Previous(), value, suffix);
	}

	return NULL;
}